

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O2

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::FixedSizeUnpackedArrayType>
          (ASTSerializer *this,FixedSizeUnpackedArrayType *elem,bool inMembersArray)

{
  group_type_pointer pgVar1;
  flat_hash_set<const_void_*> *this_00;
  byte bVar2;
  ulong uVar3;
  SourceManager *this_01;
  JsonWriter *pJVar4;
  group_type_pointer pgVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  size_t sVar8;
  value_type *elements;
  ulong pos0;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string_view sVar16;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar17;
  string_view name;
  string_view value;
  FixedSizeUnpackedArrayType *local_90;
  string local_88;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  if (this->detailedTypeInfo == false) {
    pJVar4 = this->writer;
    Type::toString_abi_cxx11_(&local_88,&elem->super_Type);
    sVar16._M_str = local_88._M_dataplus._M_p;
    sVar16._M_len = local_88._M_string_length;
    JsonWriter::writeValue(pJVar4,sVar16);
LAB_0035fa46:
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    this_00 = &this->visiting;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = elem;
    uVar13 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = uVar13 >> ((byte)(this->visiting).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                            .arrays.groups_size_index & 0x3f);
    lVar11 = (uVar13 & 0xff) * 4;
    local_68 = *(uchar *)(&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word + (uVar13 & 0xff));
    uStack_67 = *(uchar *)((long)&boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::
                                  match_word(unsigned_long)::word + lVar11 + 1);
    uStack_66 = *(uchar *)((long)&boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::
                                  match_word(unsigned_long)::word + lVar11 + 2);
    bStack_65 = *(byte *)((long)&boost::unordered::detail::foa::
                                 group15<boost::unordered::detail::foa::plain_integral>::
                                 match_word(unsigned_long)::word + lVar11 + 3);
    uVar3 = (this->visiting).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            .arrays.groups_size_mask;
    uVar10 = 0;
    uVar12 = pos0;
    do {
      pgVar5 = (this->visiting).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
               .arrays.groups_ + uVar12;
      local_48 = pgVar5->m[0].n;
      uStack_47 = pgVar5->m[1].n;
      uStack_46 = pgVar5->m[2].n;
      bStack_45 = pgVar5->m[3].n;
      uStack_44 = pgVar5->m[4].n;
      uStack_43 = pgVar5->m[5].n;
      uStack_42 = pgVar5->m[6].n;
      bStack_41 = pgVar5->m[7].n;
      uStack_40 = pgVar5->m[8].n;
      uStack_3f = pgVar5->m[9].n;
      uStack_3e = pgVar5->m[10].n;
      bStack_3d = pgVar5->m[0xb].n;
      uStack_3c = pgVar5->m[0xc].n;
      uStack_3b = pgVar5->m[0xd].n;
      uStack_3a = pgVar5->m[0xe].n;
      bStack_39 = pgVar5->m[0xf].n;
      auVar14[0] = -(local_48 == local_68);
      auVar14[1] = -(uStack_47 == uStack_67);
      auVar14[2] = -(uStack_46 == uStack_66);
      auVar14[3] = -(bStack_45 == bStack_65);
      auVar14[4] = -(uStack_44 == local_68);
      auVar14[5] = -(uStack_43 == uStack_67);
      auVar14[6] = -(uStack_42 == uStack_66);
      auVar14[7] = -(bStack_41 == bStack_65);
      auVar14[8] = -(uStack_40 == local_68);
      auVar14[9] = -(uStack_3f == uStack_67);
      auVar14[10] = -(uStack_3e == uStack_66);
      auVar14[0xb] = -(bStack_3d == bStack_65);
      auVar14[0xc] = -(uStack_3c == local_68);
      auVar14[0xd] = -(uStack_3b == uStack_67);
      auVar14[0xe] = -(uStack_3a == uStack_66);
      auVar14[0xf] = -(bStack_39 == bStack_65);
      for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe); local_90 = elem,
          uVar9 != 0; uVar9 = uVar9 - 1 & uVar9) {
        uVar6 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        if ((FixedSizeUnpackedArrayType *)
            (this->visiting).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            .arrays.elements_[uVar12 * 0xf + (ulong)uVar6] == elem) {
          pJVar4 = this->writer;
          Type::toString_abi_cxx11_(&local_88,&elem->super_Type);
          value._M_str = local_88._M_dataplus._M_p;
          value._M_len = local_88._M_string_length;
          JsonWriter::writeValue(pJVar4,value);
          goto LAB_0035fa46;
        }
      }
      bVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7];
      if ((bVar2 & bStack_39) == 0) break;
      lVar11 = uVar12 + uVar10;
      uVar10 = uVar10 + 1;
      uVar12 = lVar11 + 1U & uVar3;
    } while (uVar10 <= uVar3);
    uStack_64 = local_68;
    uStack_63 = uStack_67;
    uStack_62 = uStack_66;
    bStack_61 = bStack_65;
    uStack_60 = local_68;
    uStack_5f = uStack_67;
    uStack_5e = uStack_66;
    bStack_5d = bStack_65;
    uStack_5c = local_68;
    uStack_5b = uStack_67;
    uStack_5a = uStack_66;
    bStack_59 = bStack_65;
    if ((this->visiting).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
        .size_ctrl.size <
        (this->visiting).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
      ::unchecked_emplace_at<void_const*>
                ((locator *)&local_88,
                 (table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                  *)this_00,pos0,uVar13,&local_90);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
      ::unchecked_emplace_with_rehash<void_const*>
                ((locator *)&local_88,
                 (table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                  *)this_00,uVar13,&local_90);
    }
    if ((elem->super_Type).super_Symbol.kind != TransparentMember) {
      JsonWriter::startObject(this->writer);
      write(this,4,"name",(elem->super_Type).super_Symbol.name._M_len);
      sVar16 = ast::toString((elem->super_Type).super_Symbol.kind);
      write(this,4,"kind",sVar16._M_len);
      if ((this->includeSourceInfo == true) &&
         (this_01 = this->compilation->sourceManager, this_01 != (SourceManager *)0x0)) {
        sVar16 = SourceManager::getFileName(this_01,(elem->super_Type).super_Symbol.location);
        write(this,0xb,"source_file",sVar16._M_len);
        sVar8 = SourceManager::getLineNumber(this_01,(elem->super_Type).super_Symbol.location);
        write(this,0xb,"source_line",sVar8);
        sVar8 = SourceManager::getColumnNumber(this_01,(elem->super_Type).super_Symbol.location);
        write(this,0xd,"source_column",sVar8);
      }
      if (this->includeAddrs == true) {
        write(this,4,"addr",(size_t)elem);
      }
      sVar17 = Compilation::getAttributes(this->compilation,(Symbol *)elem);
      if (sVar17._M_extent._M_extent_value._M_extent_value != 0) {
        name._M_str = "attributes";
        name._M_len = 10;
        startArray(this,name);
        for (lVar11 = 0; sVar17._M_extent._M_extent_value._M_extent_value << 3 != lVar11;
            lVar11 = lVar11 + 8) {
          serialize(this,*(Symbol **)((long)sVar17._M_ptr + lVar11),false);
        }
        endArray(this);
      }
      FixedSizeUnpackedArrayType::serializeTo(elem,this);
      JsonWriter::endObject(this->writer);
      uVar13 = uVar13 >> ((byte)(this->visiting).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar5 = (this->visiting).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
               .arrays.groups_;
      uVar3 = (this->visiting).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
              .arrays.groups_size_mask;
      uVar12 = 0;
      do {
        pgVar1 = pgVar5 + uVar13;
        local_58 = pgVar1->m[0].n;
        uStack_57 = pgVar1->m[1].n;
        uStack_56 = pgVar1->m[2].n;
        bStack_55 = pgVar1->m[3].n;
        uStack_54 = pgVar1->m[4].n;
        uStack_53 = pgVar1->m[5].n;
        uStack_52 = pgVar1->m[6].n;
        bStack_51 = pgVar1->m[7].n;
        uStack_50 = pgVar1->m[8].n;
        uStack_4f = pgVar1->m[9].n;
        uStack_4e = pgVar1->m[10].n;
        bStack_4d = pgVar1->m[0xb].n;
        uStack_4c = pgVar1->m[0xc].n;
        uStack_4b = pgVar1->m[0xd].n;
        uStack_4a = pgVar1->m[0xe].n;
        bStack_49 = pgVar1->m[0xf].n;
        auVar15[0] = -(local_58 == local_68);
        auVar15[1] = -(uStack_57 == uStack_67);
        auVar15[2] = -(uStack_56 == uStack_66);
        auVar15[3] = -(bStack_55 == bStack_65);
        auVar15[4] = -(uStack_54 == uStack_64);
        auVar15[5] = -(uStack_53 == uStack_63);
        auVar15[6] = -(uStack_52 == uStack_62);
        auVar15[7] = -(bStack_51 == bStack_61);
        auVar15[8] = -(uStack_50 == uStack_60);
        auVar15[9] = -(uStack_4f == uStack_5f);
        auVar15[10] = -(uStack_4e == uStack_5e);
        auVar15[0xb] = -(bStack_4d == bStack_5d);
        auVar15[0xc] = -(uStack_4c == uStack_5c);
        auVar15[0xd] = -(uStack_4b == uStack_5b);
        auVar15[0xe] = -(uStack_4a == uStack_5a);
        auVar15[0xf] = -(bStack_49 == bStack_59);
        for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
            uVar9 = uVar9 - 1 & uVar9) {
          uVar6 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          if ((FixedSizeUnpackedArrayType *)
              (this->visiting).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
              .arrays.elements_[uVar13 * 0xf + (ulong)uVar6] == elem) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
            ::recover_slot((table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                            *)this_00,&pgVar5[uVar13].m[uVar6].n);
            return;
          }
        }
        if ((bVar2 & bStack_49) == 0) {
          return;
        }
        lVar11 = uVar13 + uVar12;
        uVar12 = uVar12 + 1;
        uVar13 = lVar11 + 1U & uVar3;
      } while (uVar12 <= uVar3);
    }
  }
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}